

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O3

bool __thiscall ON_PolylineCurve::SetEndPoint(ON_PolylineCurve *this,ON_3dPoint end_point)

{
  int iVar1;
  ON_3dPoint *pOVar2;
  bool bVar3;
  uint uVar4;
  
  bVar3 = ON_Curve::SetEndPoint(&this->super_ON_Curve,end_point);
  if (bVar3) {
    return true;
  }
  iVar1 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_count;
  if (iVar1 < 2) {
LAB_005917da:
    bVar3 = false;
  }
  else {
    uVar4 = iVar1 - 1;
    bVar3 = ON_3dPoint::IsValid((this->m_pline).super_ON_3dPointArray.
                                super_ON_SimpleArray<ON_3dPoint>.m_a + uVar4);
    pOVar2 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
    if (bVar3) {
      if ((pOVar2[uVar4].x == pOVar2->x) && (!NAN(pOVar2[uVar4].x) && !NAN(pOVar2->x))) {
        if ((pOVar2[uVar4].y == pOVar2->y) && (!NAN(pOVar2[uVar4].y) && !NAN(pOVar2->y))) {
          if ((pOVar2[uVar4].z == pOVar2->z) && (!NAN(pOVar2[uVar4].z) && !NAN(pOVar2->z)))
          goto LAB_005917da;
        }
      }
    }
    pOVar2[uVar4].z = end_point.z;
    pOVar2[uVar4].x = end_point.x;
    pOVar2[uVar4].y = end_point.y;
    bVar3 = true;
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return bVar3;
}

Assistant:

bool ON_PolylineCurve::SetEndPoint(
        ON_3dPoint end_point
        )
{
  // 10 March 2009 Dale Lear
  //    I'm using exact compare instead of the fuzzy IsClosed()
  //    check to permit setting the start point.  This fixes
  //    a bug Mikko reported that prevented making polylines
  //    exactly closed when the end points were almost exactly
  //    equal.  At this point, I don't remember why we don't allow
  //    SetEndPoint() the end point of a closed curve.
  if (ON_Curve::SetEndPoint(end_point))
    return true;
  bool rc = false;
  int count = m_pline.Count();
  if (    count >= 2 
    && ( !m_pline[count-1].IsValid()
         || m_pline[count-1].x != m_pline[0].x // used to call IsClosed()
         || m_pline[count-1].y != m_pline[0].y
         || m_pline[count-1].z != m_pline[0].z
       )
     )
  {
    m_pline[count-1] = end_point;
    rc = true;
  }
	DestroyCurveTree();
  return rc;
}